

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O0

Id dxil_spv::build_accumulate_offsets(Impl *impl,Id *ids,uint count)

{
  Id type_id;
  Builder *pBVar1;
  Operation *this;
  Operation *add_op;
  Id local_20;
  uint i;
  Id accumulated_id;
  uint count_local;
  Id *ids_local;
  Impl *impl_local;
  
  local_20 = 0;
  for (add_op._4_4_ = 0; add_op._4_4_ < count; add_op._4_4_ = add_op._4_4_ + 1) {
    if (ids[add_op._4_4_] != 0) {
      if (local_20 == 0) {
        local_20 = ids[add_op._4_4_];
      }
      else {
        pBVar1 = Converter::Impl::builder(impl);
        type_id = spv::Builder::makeUintType(pBVar1,0x20);
        this = Converter::Impl::allocate(impl,OpIAdd,type_id);
        Operation::add_id(this,local_20);
        Operation::add_id(this,ids[add_op._4_4_]);
        Converter::Impl::add(impl,this,false);
        local_20 = this->id;
      }
    }
  }
  if (local_20 == 0) {
    pBVar1 = Converter::Impl::builder(impl);
    local_20 = spv::Builder::makeUintConstant(pBVar1,0,false);
  }
  return local_20;
}

Assistant:

static spv::Id build_accumulate_offsets(Converter::Impl &impl, const spv::Id *ids, unsigned count)
{
	spv::Id accumulated_id = 0;
	for (unsigned i = 0; i < count; i++)
	{
		if (!ids[i])
			continue;

		if (!accumulated_id)
		{
			accumulated_id = ids[i];
		}
		else
		{
			auto *add_op = impl.allocate(spv::OpIAdd, impl.builder().makeUintType(32));
			add_op->add_id(accumulated_id);
			add_op->add_id(ids[i]);
			impl.add(add_op);
			accumulated_id = add_op->id;
		}
	}

	if (!accumulated_id)
		accumulated_id = impl.builder().makeUintConstant(0);

	return accumulated_id;
}